

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_std_file_readAsString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  FILE *__stream;
  JSRuntime *opaque;
  ulong uVar2;
  int64_t iVar3;
  ulong uVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  uint64_t uVar7;
  JSValue JVar8;
  JSValue JVar9;
  uint64_t max_size64;
  DynBuf dbuf;
  uint64_t local_68;
  DynBuf local_60;
  
  __stream = (FILE *)js_std_file_get(ctx,this_val);
  iVar6 = 6;
  if (__stream != (FILE *)0x0) {
    if (argc < 1) {
      iVar3 = 3;
      JVar5.float64 = 0.0;
    }
    else {
      JVar5 = (JSValueUnion)(argv->u).ptr;
      iVar3 = argv->tag;
    }
    uVar7 = 0xffffffffffffffff;
    if (((int)iVar3 == 3) ||
       (JVar8.tag = iVar3, JVar8.u.float64 = JVar5.float64, iVar1 = JS_ToIndex(ctx,&local_68,JVar8),
       uVar7 = local_68, iVar1 == 0)) {
      opaque = JS_GetRuntime(ctx);
      dbuf_init2(&local_60,opaque,js_realloc_rt);
      if (uVar7 != 0) {
        do {
          iVar1 = fgetc(__stream);
          if (iVar1 == -1) break;
          iVar1 = dbuf_putc(&local_60,(uint8_t)iVar1);
          if (iVar1 != 0) {
            dbuf_free(&local_60);
            goto LAB_00110ebd;
          }
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      JVar8 = JS_NewStringLen(ctx,(char *)local_60.buf,local_60.size);
      iVar6 = JVar8.tag;
      dbuf_free(&local_60);
      uVar4 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
      uVar2 = (ulong)JVar8.u.ptr & 0xffffffff;
      goto LAB_00110ec1;
    }
  }
LAB_00110ebd:
  uVar2 = 0;
  uVar4 = 0;
LAB_00110ec1:
  JVar9.u.ptr = (void *)(uVar2 | uVar4);
  JVar9.tag = iVar6;
  return JVar9;
}

Assistant:

static JSValue js_std_file_readAsString(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int c;
    DynBuf dbuf;
    JSValue obj;
    uint64_t max_size64;
    size_t max_size;
    JSValueConst max_size_val;
    
    if (!f)
        return JS_EXCEPTION;

    if (argc >= 1)
        max_size_val = argv[0];
    else
        max_size_val = JS_UNDEFINED;
    max_size = (size_t)-1;
    if (!JS_IsUndefined(max_size_val)) {
        if (JS_ToIndex(ctx, &max_size64, max_size_val))
            return JS_EXCEPTION;
        if (max_size64 < max_size)
            max_size = max_size64;
    }

    js_std_dbuf_init(ctx, &dbuf);
    while (max_size != 0) {
        c = fgetc(f);
        if (c == EOF)
            break;
        if (dbuf_putc(&dbuf, c)) {
            dbuf_free(&dbuf);
            return JS_EXCEPTION;
        }
        max_size--;
    }
    obj = JS_NewStringLen(ctx, (const char *)dbuf.buf, dbuf.size);
    dbuf_free(&dbuf);
    return obj;
}